

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O2

_Bool container_internal_validate(container_t *container,uint8_t typecode,char **reason)

{
  _Bool _Var1;
  char *pcVar2;
  
  if (container == (container_t *)0x0) {
    pcVar2 = "container is NULL";
    goto LAB_00115f52;
  }
  if (typecode == '\x04') {
    if (*(int *)((long)container + 0xc) == 0) {
      pcVar2 = "shared container has zero refcount";
      goto LAB_00115f52;
    }
    typecode = *(uint8_t *)((long)container + 8);
    if (typecode == '\x04') {
      pcVar2 = "shared container is nested";
      goto LAB_00115f52;
    }
    container = *container;
    if ((array_container_t *)container == (array_container_t *)0x0) {
      pcVar2 = "shared container has NULL container";
      goto LAB_00115f52;
    }
  }
  if (typecode == '\x03') {
    _Var1 = run_container_validate((run_container_t *)container,reason);
    return _Var1;
  }
  if (typecode == '\x02') {
    _Var1 = array_container_validate((array_container_t *)container,reason);
    return _Var1;
  }
  if (typecode == '\x01') {
    _Var1 = bitset_container_validate((bitset_container_t *)container,reason);
    return _Var1;
  }
  pcVar2 = "invalid typecode";
LAB_00115f52:
  *reason = pcVar2;
  return false;
}

Assistant:

bool container_internal_validate(const container_t *container, uint8_t typecode,
                                 const char **reason) {
    if (container == NULL) {
        *reason = "container is NULL";
        return false;
    }
    // Not using container_unwrap_shared because it asserts if shared containers
    // are nested
    if (typecode == SHARED_CONTAINER_TYPE) {
        const shared_container_t *shared_container =
            const_CAST_shared(container);
        if (croaring_refcount_get(&shared_container->counter) == 0) {
            *reason = "shared container has zero refcount";
            return false;
        }
        if (shared_container->typecode == SHARED_CONTAINER_TYPE) {
            *reason = "shared container is nested";
            return false;
        }
        if (shared_container->container == NULL) {
            *reason = "shared container has NULL container";
            return false;
        }
        container = shared_container->container;
        typecode = shared_container->typecode;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_validate(const_CAST_bitset(container),
                                             reason);
        case ARRAY_CONTAINER_TYPE:
            return array_container_validate(const_CAST_array(container),
                                            reason);
        case RUN_CONTAINER_TYPE:
            return run_container_validate(const_CAST_run(container), reason);
        default:
            *reason = "invalid typecode";
            return false;
    }
}